

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_experimental.c
# Opt level: O0

char * experimental_all_tests(void)

{
  undefined8 local_10;
  
  test_message = test_matrix4_transformation_decompose_translation();
  tests_run = tests_run + 1;
  local_10 = test_message;
  if (test_message == (char *)0x0) {
    test_message = test_matrix4_transformation_decompose_scaling();
    tests_run = tests_run + 1;
    local_10 = test_message;
    if (test_message == (char *)0x0) {
      local_10 = (char *)0x0;
    }
  }
  return local_10;
}

Assistant:

static char *experimental_all_tests(void)
{
	run_test(test_matrix4_transformation_decompose_translation);
	run_test(test_matrix4_transformation_decompose_scaling);

	return NULL;
}